

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QString,VcsolutionDepend*>::emplace<VcsolutionDepend*const&>
          (QHash<QString,VcsolutionDepend*> *this,QString *key,VcsolutionDepend **args)

{
  VcsolutionDepend *pVVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QHash<QString,_VcsolutionDepend_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pVVar1 = *(VcsolutionDepend **)this;
  if (pVVar1 == (VcsolutionDepend *)0x0) {
    local_28.d = (Data *)0x0;
  }
  else {
    if (*(uint *)&(pVVar1->uuid).d.d < 2) {
      if ((pVVar1->uuid).d.ptr < (char16_t *)((ulong)(pVVar1->uuid).d.size >> 1)) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar2 = (piter)emplace_helper<VcsolutionDepend*const&>(this,key,args);
          return (iterator)pVar2;
        }
      }
      else {
        local_28.d = (Data *)*args;
        pVar2 = (piter)emplace_helper<VcsolutionDepend*>(this,key,(VcsolutionDepend **)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar2;
        }
      }
      goto LAB_001d4604;
    }
    local_28.d = (Data *)pVVar1;
    if (*(int *)&(pVVar1->uuid).d.d != -1) {
      LOCK();
      *(int *)&(pVVar1->uuid).d.d = *(int *)&(pVVar1->uuid).d.d + 1;
      UNLOCK();
    }
  }
  QHash<QString,_VcsolutionDepend_*>::detach((QHash<QString,_VcsolutionDepend_*> *)this);
  pVar2 = (piter)emplace_helper<VcsolutionDepend*const&>(this,key,args);
  QHash<QString,_VcsolutionDepend_*>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_001d4604:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }